

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O0

bool __thiscall
gss::innards::Lackey::reduce_initial_bounds(Lackey *this,RestrictRangeFunction *restrict_range)

{
  string_view n_00;
  byte bVar1;
  __type _Var2;
  undefined1 uVar3;
  bool bVar4;
  byte bVar5;
  pointer pIVar6;
  ostream *poVar7;
  void *pvVar8;
  istream *piVar9;
  undefined8 uVar10;
  long *plVar11;
  int i_2;
  int i_1;
  anon_class_24_3_091e47fb delete_one;
  optional<int> p;
  int upper;
  int lower;
  string k;
  int i;
  int n;
  string response;
  string operation;
  string command;
  unique_lock<std::mutex> lock;
  string *in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  _Optional_payload_base<int> in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  allocator<char> *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  int iVar13;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb6c;
  undefined1 in_stack_fffffffffffffb6e;
  anon_class_24_3_091e47fb *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb78;
  int local_410;
  int local_40c;
  int local_330;
  int local_32c;
  string local_328 [32];
  int local_308;
  undefined1 local_301;
  int local_260;
  undefined1 local_259;
  undefined4 local_198;
  undefined1 local_191;
  string local_150 [39];
  undefined1 local_129;
  string local_a8 [38];
  undefined1 local_82;
  allocator<char> local_49;
  string local_48 [71];
  byte local_1;
  
  std::unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
  operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
              *)0x199eac);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             (mutex_type *)in_stack_fffffffffffffaf8);
  pIVar6 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x199ec9);
  pIVar6->number_of_calls = pIVar6->number_of_calls + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::allocator<char>::~allocator(&local_49);
  pIVar6 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x199f27);
  poVar7 = std::operator<<((ostream *)&pIVar6->send_to,local_48);
  poVar7 = std::operator<<(poVar7," ");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,0);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  pIVar6 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x199f9f);
  bVar1 = std::ios::operator!(&pIVar6->send_to + *(long *)(*(long *)&pIVar6->send_to + -0x18));
  if ((bVar1 & 1) != 0) {
    local_82 = 1;
    uVar10 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    DisobedientLackeyError::DisobedientLackeyError
              ((DisobedientLackeyError *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8);
    local_82 = 0;
    __cxa_throw(uVar10,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb10);
  iVar13 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  pIVar6 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x19a117);
  piVar9 = std::operator>>((istream *)&pIVar6->read_from,local_a8);
  bVar1 = std::ios::operator!(piVar9 + *(long *)(*(long *)piVar9 + -0x18));
  if (((bVar1 & 1) == 0) &&
     (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                              in_stack_fffffffffffffb18), ((_Var2 ^ 0xffU) & 1) == 0)) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb10);
    pIVar6 = std::
             unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
             ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                           *)0x19a351);
    piVar9 = std::operator>>((istream *)&pIVar6->read_from,local_150);
    bVar1 = std::ios::operator!(piVar9 + *(long *)(*(long *)piVar9 + -0x18));
    if ((bVar1 & 1) != 0) {
      local_191 = 1;
      uVar10 = __cxa_allocate_exception(0x28);
      std::operator+(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      std::operator+(in_stack_fffffffffffffb08,
                     (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      DisobedientLackeyError::DisobedientLackeyError
                ((DisobedientLackeyError *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 in_stack_fffffffffffffaf8);
      local_191 = 0;
      __cxa_throw(uVar10,&DisobedientLackeyError::typeinfo,
                  DisobedientLackeyError::~DisobedientLackeyError);
    }
    uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                            (char *)in_stack_fffffffffffffaf8);
    if ((bool)uVar3) {
      pIVar6 = std::
               unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
               ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             *)0x19a73c);
      plVar11 = (long *)std::istream::operator>>(&pIVar6->read_from,&local_260);
      bVar5 = std::ios::operator!((void *)((long)plVar11 + *(long *)(*plVar11 + -0x18)));
      if ((bVar5 & 1) != 0) {
        local_301 = 1;
        uVar10 = __cxa_allocate_exception(0x28);
        std::__cxx11::to_string(iVar13);
        std::operator+((char *)in_stack_fffffffffffffb08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        std::operator+(in_stack_fffffffffffffb08,
                       (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        std::operator+(in_stack_fffffffffffffb08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        std::operator+(in_stack_fffffffffffffb08,
                       (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        DisobedientLackeyError::DisobedientLackeyError
                  ((DisobedientLackeyError *)
                   CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   in_stack_fffffffffffffaf8);
        local_301 = 0;
        __cxa_throw(uVar10,&DisobedientLackeyError::typeinfo,
                    DisobedientLackeyError::~DisobedientLackeyError);
      }
      for (local_308 = 0; local_308 < local_260; local_308 = local_308 + 1) {
        psVar12 = local_328;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb10);
        pIVar6 = std::
                 unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                               *)0x19a980);
        piVar9 = std::operator>>((istream *)&pIVar6->read_from,psVar12);
        iVar13 = (int)((ulong)psVar12 >> 0x20);
        pvVar8 = (void *)std::istream::operator>>(piVar9,&local_32c);
        plVar11 = (long *)std::istream::operator>>(pvVar8,&local_330);
        bVar5 = std::ios::operator!((void *)((long)plVar11 + *(long *)(*plVar11 + -0x18)));
        if ((bVar5 & 1) != 0) {
          uVar10 = __cxa_allocate_exception(0x28);
          std::__cxx11::to_string(iVar13);
          std::operator+((char *)in_stack_fffffffffffffb08,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
          std::operator+(in_stack_fffffffffffffb08,
                         (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
          std::operator+(in_stack_fffffffffffffb08,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
          std::operator+(in_stack_fffffffffffffb08,
                         (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
          DisobedientLackeyError::DisobedientLackeyError
                    ((DisobedientLackeyError *)
                     CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                     in_stack_fffffffffffffaf8);
          __cxa_throw(uVar10,&DisobedientLackeyError::typeinfo,
                      DisobedientLackeyError::~DisobedientLackeyError);
        }
        pIVar6 = std::
                 unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                               *)0x19abdb);
        in_stack_fffffffffffffb08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pIVar6->pattern_graph;
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        n_00._M_str._0_7_ = in_stack_fffffffffffffb78;
        n_00._M_len = (size_t)in_stack_fffffffffffffb70;
        n_00._M_str._7_1_ = bVar1;
        in_stack_fffffffffffffb10 =
             (_Optional_payload_base<int>)
             InputGraph::vertex_from_name
                       ((InputGraph *)
                        CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb6e,
                                                CONCAT24(in_stack_fffffffffffffb6c,
                                                         in_stack_fffffffffffffb68))),n_00);
        bVar4 = std::optional::operator_cast_to_bool((optional<int> *)0x19ac3f);
        if (bVar4) {
          for (local_40c = 1; local_410 = local_330, local_40c < local_32c;
              local_40c = local_40c + 1) {
            reduce_initial_bounds::anon_class_24_3_091e47fb::operator()
                      (in_stack_fffffffffffffb70,
                       CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb6c))
                      );
          }
          while( true ) {
            local_410 = local_410 + 1;
            in_stack_fffffffffffffb00 = local_410;
            std::
            unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
            operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                        *)0x19ace7);
            in_stack_fffffffffffffb04 = InputGraph::size((InputGraph *)0x19acf3);
            if (in_stack_fffffffffffffb04 <= in_stack_fffffffffffffb00) break;
            reduce_initial_bounds::anon_class_24_3_091e47fb::operator()
                      (in_stack_fffffffffffffb70,
                       CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb6c))
                      );
          }
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
      }
      local_1 = 1;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                              (char *)in_stack_fffffffffffffaf8);
      if (!bVar4) {
        local_259 = 1;
        uVar10 = __cxa_allocate_exception(0x28);
        std::operator+(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        std::operator+(in_stack_fffffffffffffb08,
                       (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        std::operator+(in_stack_fffffffffffffb08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        std::operator+(in_stack_fffffffffffffb08,
                       (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        std::operator+(in_stack_fffffffffffffb08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        std::operator+(in_stack_fffffffffffffb08,
                       (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        DisobedientLackeyError::DisobedientLackeyError
                  ((DisobedientLackeyError *)
                   CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   in_stack_fffffffffffffaf8);
        local_259 = 0;
        __cxa_throw(uVar10,&DisobedientLackeyError::typeinfo,
                    DisobedientLackeyError::~DisobedientLackeyError);
      }
      local_1 = 0;
    }
    local_198 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    return (bool)(local_1 & 1);
  }
  local_129 = 1;
  uVar10 = __cxa_allocate_exception(0x28);
  std::operator+(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::operator+(in_stack_fffffffffffffb08,
                 (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  std::operator+(in_stack_fffffffffffffb08,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  std::operator+(in_stack_fffffffffffffb08,
                 (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  DisobedientLackeyError::DisobedientLackeyError
            ((DisobedientLackeyError *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)
             ,in_stack_fffffffffffffaf8);
  local_129 = 0;
  __cxa_throw(uVar10,&DisobedientLackeyError::typeinfo,
              DisobedientLackeyError::~DisobedientLackeyError);
}

Assistant:

auto Lackey::reduce_initial_bounds(
    const RestrictRangeFunction & restrict_range) -> bool
{
    unique_lock<mutex> lock{_imp->external_solver_mutex};
    ++_imp->number_of_calls;

    string command = "I";
    _imp->send_to << command << " " << 0 << endl;

    if (! _imp->send_to)
        throw DisobedientLackeyError{"error giving lackey its orders"};

    string operation;
    if (! (_imp->read_from >> operation) || operation != command)
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it replied with '" + operation + "'"};

    string response;
    if (! (_imp->read_from >> response))
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it gave no T/F"};
    else if (response == "T") {
        /* nothing */
    }
    else if (response == "F")
        return false;
    else
        throw DisobedientLackeyError{"asked lackey to " + command + " but it replied with '" + operation + "' then '" + response + "'"};

    int n;
    if (! (_imp->read_from >> n))
        throw DisobedientLackeyError{"lackey replied with length '" + to_string(n) + "' to " + command + " query"};

    for (int i = 0; i < n; ++i) {
        string k;
        int lower, upper;
        if (! (_imp->read_from >> k >> lower >> upper))
            throw DisobedientLackeyError{"lackey gave bad response triple " + to_string(i) + " to " + command + " query"};
        auto p = _imp->pattern_graph.vertex_from_name(k);
        if (p) {
            auto delete_one = [&](int v) {
                auto v_name = _imp->target_graph.vertex_from_name(to_string(v));
                if (v_name)
                    restrict_range(*p, *v_name);
            };

            for (int i = 1; i < lower; ++i)
                delete_one(i);
            for (int i = upper + 1; i < _imp->target_graph.size(); ++i)
                delete_one(i);
        }
    }

    return true;
}